

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

void Abc_NodeInvUpdateFanPolarity(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_1c;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjFaninNum(pObj);
  if ((iVar1 != 0) && (iVar1 = Abc_SclObjIsBufInv(pObj), iVar1 == 0)) {
    __assert_fail("Abc_ObjFaninNum(pObj) == 0 || Abc_SclObjIsBufInv(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                  ,0x146,"void Abc_NodeInvUpdateFanPolarity(Abc_Obj_t *)");
  }
  local_1c = 0;
  while( true ) {
    iVar1 = Abc_ObjFanoutNum(pObj);
    if (iVar1 <= local_1c) {
      return;
    }
    pObj_00 = Abc_ObjFanout(pObj,local_1c);
    iVar1 = Abc_ObjFaninNum(pObj_00);
    if (iVar1 < 1) break;
    iVar1 = Abc_SclObjIsBufInv(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Abc_NodeFindFanin(pObj_00,pObj);
      Abc_ObjFaninFlipPhase(pObj_00,iVar1);
    }
    else {
      Abc_NodeInvUpdateFanPolarity(pObj_00);
    }
    local_1c = local_1c + 1;
  }
  __assert_fail("Abc_ObjFaninNum(pFanout) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                ,0x149,"void Abc_NodeInvUpdateFanPolarity(Abc_Obj_t *)");
}

Assistant:

void Abc_NodeInvUpdateFanPolarity( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( Abc_ObjFaninNum(pObj) == 0 || Abc_SclObjIsBufInv(pObj) );
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        assert( Abc_ObjFaninNum(pFanout) > 0 );
        if ( Abc_SclObjIsBufInv(pFanout) )
            Abc_NodeInvUpdateFanPolarity( pFanout );
        else
            Abc_ObjFaninFlipPhase( pFanout, Abc_NodeFindFanin(pFanout, pObj) );
    }
}